

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O1

int32_t u_parseCodePoints(char *s,uint32_t *dest,int32_t destCapacity,UErrorCode *pErrorCode)

{
  byte bVar1;
  ulong uVar2;
  UErrorCode UVar3;
  ulong uVar4;
  uint uVar5;
  char *end;
  byte *local_38;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar3 = U_ILLEGAL_ARGUMENT_ERROR;
    if ((-1 < destCapacity && s != (char *)0x0) && (dest != (uint32_t *)0x0 || destCapacity < 1)) {
      uVar5 = 0;
LAB_001eb290:
      for (; uVar2 = (ulong)(byte)*s, uVar2 < 0x3c; s = (char *)((byte *)s + 1)) {
        if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) {
          if ((0x800000000000001U >> (uVar2 & 0x3f) & 1) != 0) {
            return uVar5;
          }
          break;
        }
      }
      uVar2 = strtoul(s,(char **)&local_38,0x10);
      UVar3 = U_PARSE_ERROR;
      if (s < local_38) {
        bVar1 = *local_38;
        if ((((0x3b < (ulong)bVar1) || ((0x800000100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
            (bVar1 != 0)) || (0x10ffff < (uint)uVar2)) goto LAB_001eb277;
        s = (char *)local_38;
        if ((int)uVar5 < destCapacity) {
          uVar4 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          dest[uVar4] = (uint)uVar2;
        }
        else {
          *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
        }
        goto LAB_001eb290;
      }
    }
LAB_001eb277:
    *pErrorCode = UVar3;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseCodePoints(const char *s,
                  uint32_t *dest, int32_t destCapacity,
                  UErrorCode *pErrorCode) {
    char *end;
    uint32_t value;
    int32_t count;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(s==NULL || destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    count=0;
    for(;;) {
        s=u_skipWhitespace(s);
        if(*s==';' || *s==0) {
            return count;
        }

        /* read one code point */
        value=(uint32_t)uprv_strtoul(s, &end, 16);
        if(end<=s || (!U_IS_INV_WHITESPACE(*end) && *end!=';' && *end!=0) || value>=0x110000) {
            *pErrorCode=U_PARSE_ERROR;
            return 0;
        }

        /* append it to the destination array */
        if(count<destCapacity) {
            dest[count++]=value;
        } else {
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        }

        /* go to the following characters */
        s=end;
    }
}